

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketData.h
# Opt level: O0

void __thiscall uWS::WebSocketData::~WebSocketData(WebSocketData *this)

{
  void *pvVar1;
  long in_RDI;
  
  if ((*(long *)(in_RDI + 0x60) != 0) && (pvVar1 = *(void **)(in_RDI + 0x60), pvVar1 != (void *)0x0)
     ) {
    DeflationStream::~DeflationStream((DeflationStream *)0x24bb88);
    operator_delete(pvVar1,0x70);
  }
  if ((*(long *)(in_RDI + 0x68) != 0) && (pvVar1 = *(void **)(in_RDI + 0x68), pvVar1 != (void *)0x0)
     ) {
    Subscriber::~Subscriber((Subscriber *)0x24bbc3);
    operator_delete(pvVar1,0x20);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 0x38));
  AsyncSocketData<false>::~AsyncSocketData((AsyncSocketData<false> *)0x24bbec);
  return;
}

Assistant:

~WebSocketData() {
        if (deflationStream) {
            delete deflationStream;
        }

        if (subscriber) {
            delete subscriber;
        }
    }